

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int magma_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  int reason;
  uint uVar10;
  bool bVar11;
  uchar seq [8];
  uchar adjusted_iv [8];
  uchar newkey [32];
  undefined8 local_58;
  undefined8 local_50;
  uchar local_48 [32];
  
  if (type == 0x2a) {
    uVar5 = EVP_CIPHER_CTX_get0_cipher(ctx);
    iVar2 = EVP_CIPHER_get_mode(uVar5);
    if (iVar2 != 5) {
      return -1;
    }
    lVar4 = EVP_CIPHER_CTX_get_cipher_data(ctx);
    local_58 = *ptr;
    if (arg == 1) {
      uVar3 = 7;
      do {
        uVar6 = (ulong)uVar3;
        if (*(char *)((long)&local_58 + uVar6) != '\0') {
          *(char *)((long)&local_58 + uVar6) = *(char *)((long)&local_58 + uVar6) + -1;
          break;
        }
        *(undefined1 *)((long)&local_58 + uVar6) = 0xff;
        bVar11 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar11);
    }
    if (1 < (uint)arg) {
      ERR_GOST_error(0xa3,0x68,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                     ,0x51d);
      return -1;
    }
    iVar2 = gost_tlstree(0x4a6,(uchar *)(lVar4 + 0x1c),local_48,(uchar *)&local_58);
    if (iVar2 < 1) {
      return -1;
    }
    local_50 = 0;
    puVar7 = (undefined4 *)EVP_CIPHER_CTX_original_iv(ctx);
    local_50 = CONCAT44(local_50._4_4_,*puVar7);
    uVar3 = 0;
    lVar8 = 3;
    do {
      uVar10 = (uint)*(byte *)((long)&local_58 + lVar8 + 4) + local_48[lVar8 + -8] + uVar3;
      uVar3 = (uint)(0xff < uVar10);
      local_48[lVar8 + -8] = (uchar)uVar10;
      bVar11 = lVar8 != 0;
      lVar8 = lVar8 + -1;
    } while (bVar11);
    EVP_CIPHER_CTX_set_num(ctx,0);
    puVar9 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(ctx);
    *puVar9 = local_50;
    magma_key((gost_ctx *)(lVar4 + 0x1c),local_48);
  }
  else {
    if (type != 0x20) {
      if (type == 6) {
        uVar1 = EVP_CIPHER_CTX_get_key_length(ctx);
        iVar2 = RAND_priv_bytes(ptr,uVar1);
        if (0 < iVar2) {
          return 1;
        }
        reason = 0x7e;
        iVar2 = 0x4ef;
      }
      else {
        reason = 0x82;
        iVar2 = 0x534;
      }
      ERR_GOST_error(0xa3,reason,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                     ,iVar2);
      return -1;
    }
    lVar4 = EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (lVar4 == 0) {
      return -1;
    }
    if (*(int *)(lVar4 + 4) != 0) {
      return -1;
    }
    *(int *)(lVar4 + 8) = arg;
  }
  return 1;
}

Assistant:

static int magma_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
    case EVP_CTRL_KEY_MESH:
        {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            c->key_meshing = arg;
            return 1;
        }
    case EVP_CTRL_TLSTREE:
        {
            unsigned char newkey[32];
            int mode = EVP_CIPHER_CTX_mode(ctx);
            struct ossl_gost_cipher_ctx *ctr_ctx = NULL;
            gost_ctx *c = NULL;

            unsigned char adjusted_iv[8];
            unsigned char seq[8];
            int j, carry, decrement_arg;
            if (mode != EVP_CIPH_CTR_MODE)
                return -1;

            ctr_ctx = (struct ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
            c = &(ctr_ctx->cctx);

            /*
             * 'arg' parameter indicates what we should do with sequence value.
             * 
             * When function called, seq is incremented after MAC calculation.
             * In ETM mode, we use seq 'as is' in the ctrl-function (arg = 0)
             * Otherwise we have to decrease it in the implementation (arg = 1).
             */
            memcpy(seq, ptr, 8);
            decrement_arg = arg;
            if(!decrement_sequence(seq, decrement_arg)) {
                GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_CTRL_CALL_FAILED);
                return -1;
            }

            if (gost_tlstree(NID_magma_cbc, (const unsigned char *)c->master_key, newkey,
                             (const unsigned char *)seq) > 0) {
                memset(adjusted_iv, 0, 8);
                memcpy(adjusted_iv, EVP_CIPHER_CTX_original_iv(ctx), 4);
                for (j = 3, carry = 0; j >= 0; j--)
                {
                    int adj_byte = adjusted_iv[j] + seq[j+4] + carry;
                    carry = (adj_byte > 255) ? 1 : 0;
                    adjusted_iv[j] = adj_byte & 0xFF;
                }
                EVP_CIPHER_CTX_set_num(ctx, 0);
                memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), adjusted_iv, 8);

                magma_key(c, newkey);
                return 1;
          }
        }
        return -1;
    default:
        GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}